

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_boost.cpp
# Opt level: O1

void __thiscall
jetbrains::teamcity::TeamcityBoostLogFormatter::log_entry_start
          (TeamcityBoostLogFormatter *this,ostream *param_1,log_entry_data *entry_data,
          log_entry_types param_3)

{
  ostream *poVar1;
  stringstream ss;
  char local_1b8;
  undefined7 uStack_1b7;
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198,_S_out);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_188,*(char **)entry_data,*(long *)(entry_data + 8));
  local_1b8 = ':';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b8,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)&this->currentDetails,CONCAT71(uStack_1b7,local_1b8));
  if ((long *)CONCAT71(uStack_1b7,local_1b8) != local_1a8) {
    operator_delete((long *)CONCAT71(uStack_1b7,local_1b8),local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void TeamcityBoostLogFormatter::log_entry_start(
    std::ostream& /*out*/
  , const boost::unit_test::log_entry_data& entry_data
  , log_entry_types /*let*/
  )
{
    std::stringstream ss(std::ios_base::out);
    ss  << entry_data.m_file_name << ':' << entry_data.m_line_num << ": ";
    currentDetails += ss.str();
}